

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpASIOListener.cpp
# Opt level: O3

void __thiscall mognetwork::TcpASIOListener::~TcpASIOListener(TcpASIOListener *this)

{
  list<mognetwork::TcpSocket_*,_std::allocator<mognetwork::TcpSocket_*>_> *plVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  
  (this->super_IRunnable)._vptr_IRunnable = (_func_int **)&PTR__TcpASIOListener_00113bb0;
  if (this->m_server == (TcpASIOServer *)0x0) {
    if (this->m_mutex != (Mutex *)0x0) {
      (*this->m_mutex->_vptr_Mutex[1])();
    }
    plVar1 = this->m_socketList;
    if (plVar1 != (list<mognetwork::TcpSocket_*,_std::allocator<mognetwork::TcpSocket_*>_> *)0x0) {
      p_Var3 = (plVar1->
               super__List_base<mognetwork::TcpSocket_*,_std::allocator<mognetwork::TcpSocket_*>_>).
               _M_impl._M_node.super__List_node_base._M_next;
      while (p_Var3 != (_List_node_base *)plVar1) {
        p_Var2 = (((_List_base<mognetwork::TcpSocket_*,_std::allocator<mognetwork::TcpSocket_*>_> *)
                  &p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        operator_delete(p_Var3);
        p_Var3 = p_Var2;
      }
      operator_delete(plVar1);
    }
  }
  close(this->m_pipefd[0]);
  close(this->m_pipefd[1]);
  if (this->m_thread != (Thread *)0x0) {
    (*this->m_thread->_vptr_Thread[1])();
  }
  Selector::~Selector(&this->m_selector);
  p_Var3 = (this->m_listeners).
           super__List_base<mognetwork::ITcpASIOListenerHandler_*,_std::allocator<mognetwork::ITcpASIOListenerHandler_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var3 != (_List_node_base *)&this->m_listeners) {
    p_Var2 = p_Var3->_M_next;
    operator_delete(p_Var3);
    p_Var3 = p_Var2;
  }
  return;
}

Assistant:

TcpASIOListener::~TcpASIOListener()
  {
    if (m_server == NULL)
      {
	if (m_mutex != NULL)
	  delete (m_mutex);
	if (m_socketList != NULL)
	  delete (m_socketList);
      }
#ifndef OS_WINDOWS
    ::close(m_pipefd[0]);
    ::close(m_pipefd[1]);
#else
	_close(m_pipefd[0]);
	_close(m_pipefd[1]);
#endif // !OS_WINDOWS
    delete m_thread;
  }